

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O1

int32 rw::getSizeSkin(void *object,int32 offset,int32 param_3)

{
  int iVar1;
  int *piVar2;
  int32 iVar3;
  int iVar4;
  Geometry *geometry;
  
  if (*(undefined4 **)((long)object + 0x98) != (undefined4 *)0x0) {
    switch(**(undefined4 **)((long)object + 0x98)) {
    case 4:
      iVar3 = ps2::getSizeNativeSkin(object,offset);
      return iVar3;
    case 5:
      iVar3 = xbox::getSizeNativeSkin(object,offset);
      return iVar3;
    case 8:
    case 9:
      return -1;
    case 0xb:
      iVar3 = wdgl::getSizeNativeSkin(object,offset);
      return iVar3;
    }
  }
  piVar2 = *(int **)((long)object + (long)offset);
  if (piVar2 == (int *)0x0) {
    return -1;
  }
  iVar1 = *piVar2;
  if (version < 0x34000) {
    iVar4 = iVar1 << 2;
  }
  else {
    if (piVar2[0xd] == 0) {
      iVar4 = 0xc;
    }
    else {
      iVar4 = iVar1 + (piVar2[0xd] + piVar2[0xe]) * 2 + 0xc;
    }
    iVar4 = iVar4 + piVar2[1];
  }
  return iVar1 * 0x40 + *(int *)((long)object + 0x1c) * 0x14 + 4 + iVar4;
}

Assistant:

static int32
getSizeSkin(void *object, int32 offset, int32)
{
	Geometry *geometry = (Geometry*)object;

	if(geometry->instData){
		if(geometry->instData->platform == PLATFORM_PS2)
			return ps2::getSizeNativeSkin(object, offset);
		if(geometry->instData->platform == PLATFORM_WDGL)
			return wdgl::getSizeNativeSkin(object, offset);
		if(geometry->instData->platform == PLATFORM_XBOX)
			return xbox::getSizeNativeSkin(object, offset);
		if(geometry->instData->platform == PLATFORM_D3D8)
			return -1;
		if(geometry->instData->platform == PLATFORM_D3D9)
			return -1;
		assert(0 && "unsupported native skin platform");
	}

	Skin *skin = *PLUGINOFFSET(Skin*, object, offset);
	if(skin == nil)
		return -1;

	int32 size = 4 + geometry->numVertices*(16+4) +
	             skin->numBones*64;
	// not sure which version introduced the new format
	if(version < 0x34000)
		size += skin->numBones*4;
	else
		size += skin->numUsedBones + skinSplitDataSize(skin);
	return size;
}